

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_connection.c
# Opt level: O0

void amqp_maybe_release_buffers_on_channel(amqp_connection_state_t state,amqp_channel_t channel)

{
  amqp_pool_t *paVar1;
  amqp_channel_t in_SI;
  amqp_connection_state_t in_RDI;
  amqp_frame_t *frame;
  amqp_pool_t *pool;
  amqp_link_t *queued_link;
  amqp_link_t *local_18;
  
  if (in_RDI->state == CONNECTION_STATE_IDLE) {
    for (local_18 = in_RDI->first_queued_frame; local_18 != (amqp_link_t *)0x0;
        local_18 = local_18->next) {
      if (in_SI == *(amqp_channel_t *)((long)local_18->data + 2)) {
        return;
      }
    }
    paVar1 = amqp_get_channel_pool(in_RDI,in_SI);
    if (paVar1 != (amqp_pool_t *)0x0) {
      recycle_amqp_pool((amqp_pool_t *)0x109641);
    }
  }
  return;
}

Assistant:

void amqp_maybe_release_buffers_on_channel(amqp_connection_state_t state,
                                           amqp_channel_t channel) {
  amqp_link_t *queued_link;
  amqp_pool_t *pool;
  if (CONNECTION_STATE_IDLE != state->state) {
    return;
  }

  queued_link = state->first_queued_frame;

  while (NULL != queued_link) {
    amqp_frame_t *frame = queued_link->data;
    if (channel == frame->channel) {
      return;
    }

    queued_link = queued_link->next;
  }

  pool = amqp_get_channel_pool(state, channel);

  if (pool != NULL) {
    recycle_amqp_pool(pool);
  }
}